

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdefl.h
# Opt level: O3

void sdefl_huff(uchar *lens,uint *codes,uint *freqs,uint num_syms,uint max_code_len)

{
  uint *puVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  uint len_cnt [16];
  int local_4f8 [16];
  uint local_4b8 [290];
  
  uVar18 = (ulong)num_syms;
  uVar12 = 0;
  memset(local_4b8,0,0x480);
  uVar4 = num_syms + 3 & 0xfffffffc;
  if (num_syms == 0) {
    uVar10 = 0xffffffff;
  }
  else {
    uVar8 = uVar4 - 1;
    uVar10 = (ulong)uVar8;
    uVar13 = 0;
    do {
      uVar12 = freqs[uVar13];
      if (uVar8 <= freqs[uVar13]) {
        uVar12 = uVar8;
      }
      local_4b8[uVar12] = local_4b8[uVar12] + 1;
      uVar13 = uVar13 + 1;
    } while (uVar18 != uVar13);
    if (uVar4 == 0) {
      uVar12 = 0;
    }
    else {
      uVar13 = 1;
      uVar9 = 0;
      do {
        uVar12 = local_4b8[uVar13] + uVar9;
        local_4b8[uVar13] = uVar9;
        uVar13 = uVar13 + 1;
        uVar9 = uVar12;
      } while (uVar4 != uVar13);
    }
    uVar13 = 0;
    do {
      uVar9 = freqs[uVar13];
      if (uVar9 == 0) {
        lens[uVar13] = '\0';
      }
      else {
        uVar11 = uVar10;
        if (uVar9 < uVar8) {
          uVar11 = (ulong)uVar9;
        }
        uVar14 = local_4b8[uVar11];
        local_4b8[uVar11] = uVar14 + 1;
        codes[uVar14] = (uint)uVar13 | uVar9 << 10;
      }
      uVar13 = uVar13 + 1;
    } while (uVar18 != uVar13);
  }
  uVar8 = local_4b8[uVar10] - local_4b8[uVar4 - 2];
  if (1 < uVar8) {
    puVar1 = codes + local_4b8[uVar4 - 2];
    uVar4 = uVar8 >> 1;
    do {
      uVar9 = puVar1[(ulong)uVar4 - 1];
      uVar14 = uVar4 * 2;
      uVar10 = (ulong)uVar4;
      if (uVar14 <= uVar8) {
        uVar10 = (ulong)uVar4;
        do {
          if ((uVar8 <= uVar14) ||
             (uVar13 = (ulong)(uVar14 | 1),
             puVar1[(ulong)(uVar14 | 1) - 1] <= puVar1[(ulong)uVar14 - 1])) {
            uVar13 = (ulong)uVar14;
          }
          if (puVar1[uVar13 - 1] <= uVar9) break;
          puVar1[uVar10 - 1] = puVar1[uVar13 - 1];
          uVar14 = (int)uVar13 * 2;
          uVar10 = uVar13;
        } while (uVar14 <= uVar8);
      }
      puVar1[uVar10 - 1] = uVar9;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    uVar10 = (ulong)uVar8;
    do {
      uVar4 = puVar1[uVar10 - 1];
      puVar1[uVar10 - 1] = *puVar1;
      *puVar1 = uVar4;
      if (uVar10 == 2) break;
      uVar10 = uVar10 - 1;
      uVar13 = 2;
      uVar8 = 1;
      do {
        uVar9 = (uint)uVar10;
        if ((uVar9 <= (uint)uVar13) ||
           (uVar11 = (ulong)((uint)uVar13 | 1), puVar1[uVar11 - 1] <= puVar1[uVar13 - 1])) {
          uVar11 = uVar13;
        }
        uVar16 = (ulong)uVar8;
        if (puVar1[uVar11 - 1] <= uVar4) break;
        puVar1[(ulong)uVar8 - 1] = puVar1[uVar11 - 1];
        uVar14 = (uint)uVar11 * 2;
        uVar13 = (ulong)uVar14;
        uVar16 = uVar11;
        uVar8 = (uint)uVar11;
      } while (uVar14 <= uVar9);
      puVar1[uVar16 - 1] = uVar4;
    } while (1 < uVar9);
  }
  if (uVar12 != 0) {
    if (uVar12 == 1) {
      uVar4 = (*codes & 0x3ff) + (uint)((*codes & 0x3ff) == 0);
      *codes = 0;
      *lens = '\x01';
      codes[uVar4] = 1;
      lens[uVar4] = '\x01';
    }
    else {
      iVar5 = 0;
      uVar10 = 0;
      uVar9 = 0;
      uVar8 = 0;
      uVar4 = uVar12;
      do {
        if ((uVar8 == uVar12) || ((uVar10 != uVar9 && (codes[uVar9] >> 10 < codes[uVar8] >> 10)))) {
          uVar14 = uVar8;
          uVar17 = uVar9 + 1;
          uVar15 = uVar9;
        }
        else {
          uVar14 = uVar8 + 1;
          uVar17 = uVar9;
          uVar15 = uVar8;
        }
        if ((uVar14 == uVar12) ||
           ((uVar10 != uVar17 && (codes[uVar17] >> 10 < codes[uVar14] >> 10)))) {
          uVar8 = uVar14;
          uVar14 = uVar17;
          uVar9 = uVar17 + 1;
        }
        else {
          uVar8 = uVar14 + 1;
          uVar9 = uVar17;
        }
        uVar17 = codes[uVar15];
        uVar2 = codes[uVar14];
        codes[uVar15] = (uVar17 & 0x3ff) + iVar5;
        codes[uVar14] = (codes[uVar14] & 0x3ff) + iVar5;
        codes[uVar10] = codes[uVar10] & 0x3ff | (uVar2 & 0xfffffc00) + (uVar17 & 0xfffffc00);
        uVar10 = uVar10 + 1;
        uVar4 = uVar4 - 1;
        iVar5 = iVar5 + 0x400;
      } while (1 < uVar4);
      uVar12 = uVar12 - 2;
      uVar10 = (ulong)max_code_len;
      memset(local_4f8,0,uVar10 * 4 + 4);
      local_4f8[1] = 2;
      codes[uVar12] = codes[uVar12] & 0x3ff;
      if (0 < (int)uVar12) {
        uVar13 = (ulong)uVar12;
        do {
          uVar12 = codes[codes[uVar13 - 1] >> 10] >> 10;
          uVar11 = (ulong)uVar12 + 1;
          codes[uVar13 - 1] = (uint)uVar11 << 10 | codes[uVar13 - 1] & 0x3ff;
          uVar4 = max_code_len + 1;
          if ((uint)uVar11 < max_code_len) {
            iVar5 = local_4f8[(ulong)uVar12 + 1];
            uVar4 = uVar12 + 2;
          }
          else {
            do {
              uVar11 = (ulong)(uVar4 - 2);
              iVar5 = local_4f8[uVar11];
              uVar4 = uVar4 - 1;
            } while (iVar5 == 0);
          }
          local_4f8[uVar11] = iVar5 + -1;
          local_4f8[uVar4] = local_4f8[uVar4] + 2;
          bVar3 = 1 < (long)uVar13;
          uVar13 = uVar13 - 1;
        } while (bVar3);
      }
      if (max_code_len == 0) {
        local_4b8[0] = 0;
        local_4b8[1] = 0;
      }
      else {
        uVar4 = 0;
        do {
          for (iVar5 = local_4f8[uVar10]; iVar5 != 0; iVar5 = iVar5 + -1) {
            uVar13 = (ulong)uVar4;
            uVar4 = uVar4 + 1;
            lens[codes[uVar13] & 0x3ff] = (uchar)uVar10;
          }
          uVar10 = uVar10 - 1;
        } while ((int)uVar10 != 0);
        local_4b8[0] = 0;
        local_4b8[1] = 0;
        if (max_code_len != 1) {
          lVar6 = 0;
          uVar4 = 0;
          do {
            uVar4 = (uVar4 + local_4f8[lVar6 + 1]) * 2;
            local_4b8[lVar6 + 2] = uVar4;
            lVar6 = lVar6 + 1;
          } while ((ulong)(max_code_len + 1) - 2 != lVar6);
        }
      }
      if (num_syms != 0) {
        uVar10 = 0;
        do {
          uVar4 = local_4b8[lens[uVar10]];
          local_4b8[lens[uVar10]] = uVar4 + 1;
          codes[uVar10] = uVar4;
          uVar10 = uVar10 + 1;
        } while (uVar18 != uVar10);
        if (num_syms != 0) {
          uVar10 = 0;
          do {
            uVar7 = (ushort)codes[uVar10] << 8 | (ushort)codes[uVar10] >> 8;
            uVar4 = (uVar7 & 0xf0f) << 4 | uVar7 >> 4 & 0xf0f;
            uVar4 = (uVar4 >> 2 & 0x3333) + (uVar4 & 0x3333) * 4;
            codes[uVar10] =
                 (uVar4 >> 1 & 0x5555) + (uVar4 & 0x5555) * 2 >> (0x10 - lens[uVar10] & 0x1f);
            uVar10 = uVar10 + 1;
          } while (uVar18 != uVar10);
        }
      }
    }
  }
  return;
}

Assistant:

static void
sdefl_huff(unsigned char *lens, unsigned *codes, unsigned *freqs,
           unsigned num_syms, unsigned max_code_len) {
  unsigned c, *A = codes;
  unsigned len_cnt[SDEFL_MAX_CODE_LEN + 1];
  unsigned used_syms = sdefl_sort_sym(num_syms, freqs, lens, A);
  if (!used_syms) return;
  if (used_syms == 1) {
    unsigned s = A[0] & SDEFL_SYM_MSK;
    unsigned i = s ? s : 1;
    codes[0] = 0, lens[0] = 1;
    codes[i] = 1, lens[i] = 1;
    return;
  }
  sdefl_build_tree(A, used_syms);
  sdefl_gen_len_cnt(A, used_syms-2, len_cnt, max_code_len);
  sdefl_gen_codes(A, lens, len_cnt, max_code_len, num_syms);
  for (c = 0; c < num_syms; c++) {
    codes[c] = sdefl_rev(codes[c], lens[c]);
  }
}